

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::expression_tail
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Atom *this_00;
  element_type *peVar6;
  size_type sVar7;
  element_type *peVar8;
  __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  reference pvVar9;
  const_reference __buf;
  ssize_t sVar10;
  shared_ptr<r_comp::RepliStruct> local_b8;
  allocator local_a1;
  string local_a0 [32];
  shared_ptr<r_comp::RepliStruct> local_80;
  ulong local_70;
  size_t i;
  Atom local_44 [6];
  uint16_t local_3e;
  ushort local_3c;
  byte local_3a;
  byte local_39;
  uint16_t j;
  uint16_t pattern_end_index;
  bool entered_pattern;
  uint16_t *puStack_38;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_28;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_39 = write;
  puStack_38 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_28 = p;
  p_local = (Class *)node;
  node_local = (Ptr *)this;
  if ((this->in_hlp & 1U) == 0) {
    local_3a = Class::is_pattern(p,this->_metadata);
    local_3c = 0;
  }
  else {
    local_3a = 1;
    bVar2 = r_code::Atom::getAtomCount();
    local_3c = bVar2 - 1;
  }
  if (((local_39 & 1) != 0) && ((this->state).pattern_lvl != 0)) {
    for (local_3e = extent_index_local._6_2_; uVar4 = (uint)local_3e,
        uVar5 = (uint)extent_index_local._6_2_, bVar2 = r_code::Atom::getAtomCount(),
        uVar4 < uVar5 + bVar2; local_3e = local_3e + 1) {
      r_code::Atom::Wildcard((ushort)local_44);
      this_00 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_3e);
      r_code::Atom::operator=(this_00,local_44);
      r_code::Atom::~Atom(local_44);
    }
  }
  peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  sVar7 = std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::size(&peVar6->args);
  bVar2 = r_code::Atom::getAtomCount();
  if (sVar7 != bVar2) {
    peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    peVar8 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    sVar7 = std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::size(&peVar8->args);
    this_01 = (__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ::operator[](&peVar6->args,sVar7 - 1);
    peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    bVar3 = std::operator!=(&peVar6->cmd,"::");
    if (bVar3) {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr((shared_ptr<r_comp::RepliStruct> *)&i,node);
      bVar2 = r_code::Atom::getAtomCount();
      peVar6 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
      sVar7 = std::
              vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ::size(&peVar6->args);
      set_arity_error(this,(Ptr *)&i,(ushort)bVar2,(uint16_t)sVar7);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)&i);
      return false;
    }
  }
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    sVar7 = std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::size(&peVar6->args);
    if (sVar7 <= uVar1) {
      return true;
    }
    if (((local_3a & 1) != 0) && (local_70 == 0)) {
      (this->state).pattern_lvl = (this->state).pattern_lvl + 1;
    }
    peVar6 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    pvVar9 = std::
             vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ::operator[](&peVar6->args,local_70);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_80,pvVar9);
    __buf = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::at
                      (&pCStack_28->things_to_read,local_70);
    sVar10 = read(this,(int)&local_80,__buf,1);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_80);
    if ((((byte)sVar10 ^ 0xff) & 1) != 0) break;
    if (((local_3a & 1) != 0) && (local_70 == local_3c)) {
      (this->state).pattern_lvl = (this->state).pattern_lvl - 1;
    }
    local_70 = local_70 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0," error: parsing element in expression",&local_a1);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_b8,node);
  set_error(this,(string *)local_a0,&local_b8);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_b8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return false;
}

Assistant:

bool Compiler::expression_tail(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)  // arity>0.
{
    bool entered_pattern;
    uint16_t pattern_end_index;

    if (in_hlp) {
        entered_pattern = true; //p.is_fact(_metadata);
        pattern_end_index = p.atom.getAtomCount() - 1;
    } else {
        entered_pattern = p.is_pattern(_metadata);
        pattern_end_index = 0;
    }

    if (write && state.pattern_lvl) { // fill up with wildcards that will be overwritten up to ::.
        for (uint16_t j = write_index; j < write_index + p.atom.getAtomCount(); ++j) {
            current_object->code[j] = Atom::Wildcard();
        }
    }

    if (node->args.size() != p.atom.getAtomCount() &&
        node->args[node->args.size() - 1]->cmd != "::") {
        set_arity_error(node, p.atom.getAtomCount(), node->args.size());
        return false;
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        if (entered_pattern && i == 0) { // pattern begin.
            ++state.pattern_lvl;
        }

        if (!read(node->args[i], p.things_to_read.at(i), true, write_index + i, extent_index, write)) {
            set_error(" error: parsing element in expression", node);
            return false;
        }

        if (entered_pattern && i == pattern_end_index) { // pattern end.
            --state.pattern_lvl;
        }
    }

    return true;
}